

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

void duckdb::DecimalRoundNegativePrecisionFunction<int,duckdb::NumericHelper>
               (DataChunk *input,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  int iVar2;
  int iVar3;
  ulong count;
  int *piVar4;
  int *piVar5;
  unsigned_long *puVar6;
  data_ptr_t pdVar7;
  data_ptr_t pdVar8;
  sel_t *psVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  byte bVar12;
  byte bVar13;
  int iVar14;
  BoundFunctionExpression *pBVar15;
  pointer pFVar16;
  const_reference pvVar17;
  pointer pEVar18;
  reference vector;
  TemplatedValidityData<unsigned_long> *pTVar19;
  ulong uVar20;
  ulong uVar21;
  unsigned_long uVar22;
  ulong uVar23;
  idx_t idx_in_entry;
  ulong uVar24;
  int iVar25;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  buffer_ptr<ValidityBuffer> *local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  pBVar15 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                      (&state->expr->super_BaseExpression);
  pFVar16 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
            operator->(&pBVar15->bind_info);
  pvVar17 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](&pBVar15->children,0);
  pEVar18 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar17);
  bVar12 = DecimalType::GetScale(&pEVar18->return_type);
  pvVar17 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](&pBVar15->children,0);
  pEVar18 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar17);
  bVar13 = DecimalType::GetWidth(&pEVar18->return_type);
  iVar2 = *(int *)&pFVar16[1]._vptr_FunctionData;
  if ((int)((uint)bVar12 - (uint)bVar13) < iVar2) {
    iVar3 = *(int *)(NumericHelper::POWERS_OF_TEN + (long)(int)((uint)bVar12 - iVar2) * 8);
    iVar2 = *(int *)(NumericHelper::POWERS_OF_TEN + (long)iVar2 * -8);
    iVar25 = iVar3 / 2;
    vector = vector<duckdb::Vector,_true>::operator[](&input->data,0);
    count = input->count;
    if (vector->vector_type == FLAT_VECTOR) {
      Vector::SetVectorType(result,FLAT_VECTOR);
      pdVar8 = result->data;
      pdVar7 = vector->data;
      FlatVector::VerifyFlatVector(vector);
      FlatVector::VerifyFlatVector(result);
      puVar6 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar6 == (unsigned_long *)0x0) {
        if (count != 0) {
          uVar24 = 0;
          do {
            iVar14 = iVar25;
            if (*(int *)(pdVar7 + uVar24 * 4) < 0) {
              iVar14 = -iVar25;
            }
            *(int *)(pdVar8 + uVar24 * 4) =
                 ((iVar14 + *(int *)(pdVar7 + uVar24 * 4)) / iVar3) * iVar2;
            uVar24 = uVar24 + 1;
          } while (count != uVar24);
        }
      }
      else {
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar6;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if (0x3f < count + 0x3f) {
          puVar6 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          uVar21 = 0;
          uVar24 = 0;
          do {
            if (puVar6 == (unsigned_long *)0x0) {
              uVar22 = 0xffffffffffffffff;
            }
            else {
              uVar22 = puVar6[uVar21];
            }
            uVar23 = uVar24 + 0x40;
            if (count <= uVar24 + 0x40) {
              uVar23 = count;
            }
            uVar20 = uVar23;
            if (uVar22 != 0) {
              uVar20 = uVar24;
              if (uVar22 == 0xffffffffffffffff) {
                if (uVar24 < uVar23) {
                  do {
                    iVar14 = iVar25;
                    if (*(int *)(pdVar7 + uVar24 * 4) < 0) {
                      iVar14 = -iVar25;
                    }
                    *(int *)(pdVar8 + uVar24 * 4) =
                         ((iVar14 + *(int *)(pdVar7 + uVar24 * 4)) / iVar3) * iVar2;
                    uVar24 = uVar24 + 1;
                    uVar20 = uVar24;
                  } while (uVar23 != uVar24);
                }
              }
              else if (uVar24 < uVar23) {
                uVar20 = 0;
                do {
                  if ((uVar22 >> (uVar20 & 0x3f) & 1) != 0) {
                    iVar14 = iVar25;
                    if (*(int *)(pdVar7 + uVar20 * 4 + uVar24 * 4) < 0) {
                      iVar14 = -iVar25;
                    }
                    *(int *)(pdVar8 + uVar20 * 4 + uVar24 * 4) =
                         ((iVar14 + *(int *)(pdVar7 + uVar20 * 4 + uVar24 * 4)) / iVar3) * iVar2;
                  }
                  uVar20 = uVar20 + 1;
                } while ((uVar24 - uVar23) + uVar20 != 0);
                uVar20 = uVar24 + uVar20;
              }
            }
            uVar21 = uVar21 + 1;
            uVar24 = uVar20;
          } while (uVar21 != count + 0x3f >> 6);
        }
      }
    }
    else if (vector->vector_type == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      piVar4 = (int *)result->data;
      piVar5 = (int *)vector->data;
      puVar6 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar6 != (unsigned_long *)0x0) && ((*puVar6 & 1) == 0)) {
        ConstantVector::SetNull(result,true);
        return;
      }
      ConstantVector::SetNull(result,false);
      iVar14 = -iVar25;
      if (-1 < *piVar5) {
        iVar14 = iVar25;
      }
      *piVar4 = ((iVar14 + *piVar5) / iVar3) * iVar2;
    }
    else {
      UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
      Vector::ToUnifiedFormat(vector,count,&local_78);
      Vector::SetVectorType(result,FLAT_VECTOR);
      pdVar8 = result->data;
      FlatVector::VerifyFlatVector(result);
      if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (count != 0) {
          psVar9 = (local_78.sel)->sel_vector;
          uVar24 = 0;
          do {
            uVar21 = uVar24;
            if (psVar9 != (sel_t *)0x0) {
              uVar21 = (ulong)psVar9[uVar24];
            }
            iVar14 = iVar25;
            if (*(int *)(local_78.data + uVar21 * 4) < 0) {
              iVar14 = -iVar25;
            }
            *(int *)(pdVar8 + uVar24 * 4) =
                 ((iVar14 + *(int *)(local_78.data + uVar21 * 4)) / iVar3) * iVar2;
            uVar24 = uVar24 + 1;
          } while (count != uVar24);
        }
      }
      else if (count != 0) {
        psVar9 = (local_78.sel)->sel_vector;
        local_88 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        uVar24 = 0;
        do {
          uVar21 = uVar24;
          if (psVar9 != (sel_t *)0x0) {
            uVar21 = (ulong)psVar9[uVar24];
          }
          if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar21 >> 6] >> (uVar21 & 0x3f) & 1) == 0) {
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_98,&local_80);
              p_Var11 = p_Stack_90;
              peVar10 = local_98;
              local_98 = (element_type *)0x0;
              p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = peVar10;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var11;
              if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
              }
              if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
              }
              pTVar19 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_88);
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar19->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
            }
            bVar12 = (byte)uVar24 & 0x3f;
            puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                     (uVar24 >> 6);
            *puVar1 = *puVar1 & (-2L << bVar12 | 0xfffffffffffffffeU >> 0x40 - bVar12);
          }
          else {
            iVar14 = iVar25;
            if (*(int *)(local_78.data + uVar21 * 4) < 0) {
              iVar14 = -iVar25;
            }
            *(int *)(pdVar8 + uVar24 * 4) =
                 ((iVar14 + *(int *)(local_78.data + uVar21 * 4)) / iVar3) * iVar2;
          }
          uVar24 = uVar24 + 1;
        } while (count != uVar24);
      }
      if (local_78.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
    }
  }
  else {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    Value::INTEGER((Value *)&local_78,0);
    Vector::SetValue(result,0,(Value *)&local_78);
    Value::~Value((Value *)&local_78);
  }
  return;
}

Assistant:

static void DecimalRoundNegativePrecisionFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<RoundPrecisionFunctionData>();
	auto source_scale = DecimalType::GetScale(func_expr.children[0]->return_type);
	auto width = DecimalType::GetWidth(func_expr.children[0]->return_type);
	if (info.target_scale <= -int32_t(width - source_scale)) {
		// scale too big for width
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		result.SetValue(0, Value::INTEGER(0));
		return;
	}
	T divide_power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[-info.target_scale + source_scale]);
	T multiply_power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[-info.target_scale]);
	T addition = divide_power_of_ten / 2;

	UnaryExecutor::Execute<T, T>(input.data[0], result, input.size(), [&](T input) {
		if (input < 0) {
			input -= addition;
		} else {
			input += addition;
		}
		return UnsafeNumericCast<T>(input / divide_power_of_ten * multiply_power_of_ten);
	});
}